

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void __thiscall
duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
Operation<duckdb::string_t,double,duckdb::ArgMinMaxState<duckdb::string_t,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
          (ArgMinMaxBase<duckdb::GreaterThan,true> *this,
          ArgMinMaxState<duckdb::string_t,_double> *state,string_t *x,double *y,
          AggregateBinaryInput *binary)

{
  string_t x_data;
  string_t new_value;
  
  if (*this != (ArgMinMaxBase<duckdb::GreaterThan,true>)0x0) {
    x_data.value.pointer.ptr = (char *)y;
    x_data.value._0_8_ = *(undefined8 *)&(state->arg).value;
    Execute<duckdb::string_t,double,duckdb::ArgMinMaxState<duckdb::string_t,double>>
              (this,*(ArgMinMaxState<duckdb::string_t,_double> **)state,x_data,*(double *)&x->value,
               binary);
    return;
  }
  new_value.value.pointer.ptr = (char *)y;
  new_value.value._0_8_ = *(undefined8 *)&(state->arg).value;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)(this + 8),*(string_t **)state,new_value);
  *(undefined8 *)(this + 0x18) = *(undefined8 *)&x->value;
  *this = (ArgMinMaxBase<duckdb::GreaterThan,true>)0x1;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}